

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

char * __thiscall CServer::GetMapName(CServer *this)

{
  char cVar1;
  int iVar2;
  CConfig *pCVar3;
  char *pcVar4;
  long lVar5;
  
  pCVar3 = this->m_pConfig;
  pcVar4 = pCVar3->m_SvMap;
  lVar5 = 0;
  do {
    lVar5 = lVar5 + 0x10ad;
    while( true ) {
      iVar2 = str_length(pCVar3->m_SvMap);
      if ((long)(iVar2 + -1) <= lVar5 + -0x10ad) {
        return pcVar4;
      }
      pCVar3 = this->m_pConfig;
      cVar1 = *(char *)((long)pCVar3 + lVar5 + -1);
      if ((cVar1 == '/') || (cVar1 == '\\')) break;
      lVar5 = lVar5 + 1;
    }
    pcVar4 = (char *)((long)&pCVar3->m_ClPredict + lVar5);
    lVar5 = lVar5 + -0x10ac;
  } while( true );
}

Assistant:

const char *CServer::GetMapName()
{
	// get the name of the map without his path
	char *pMapShortName = &Config()->m_SvMap[0];
	for(int i = 0; i < str_length(Config()->m_SvMap)-1; i++)
	{
		if(Config()->m_SvMap[i] == '/' || Config()->m_SvMap[i] == '\\')
			pMapShortName = &Config()->m_SvMap[i+1];
	}
	return pMapShortName;
}